

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O2

void vkt::Draw::transition2DImage
               (DeviceInterface *vk,VkCommandBuffer cmdBuffer,VkImage image,
               VkImageAspectFlags aspectMask,VkImageLayout oldLayout,VkImageLayout newLayout,
               VkAccessFlags srcAccessMask,VkAccessFlags dstAccessMask)

{
  undefined4 local_48 [2];
  undefined8 local_40;
  VkAccessFlags local_38;
  VkAccessFlags local_34;
  VkImageLayout local_30;
  VkImageLayout local_2c;
  undefined8 local_28;
  deUint64 local_20;
  VkImageAspectFlags local_18;
  undefined4 local_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 uStack_8;
  
  local_48[0] = 0x2d;
  local_40 = 0;
  local_38 = srcAccessMask;
  local_34 = dstAccessMask;
  local_28 = 0xffffffffffffffff;
  local_14 = 0;
  uStack_10 = 1;
  uStack_c = 0;
  uStack_8 = 1;
  local_30 = oldLayout;
  local_2c = newLayout;
  local_20 = image.m_internal;
  local_18 = aspectMask;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,cmdBuffer,0x8000,1,0,0,0,0,0,1,local_48);
  return;
}

Assistant:

void transition2DImage (const vk::DeviceInterface&	vk,
						vk::VkCommandBuffer			cmdBuffer,
						vk::VkImage					image,
						vk::VkImageAspectFlags		aspectMask,
						vk::VkImageLayout			oldLayout,
						vk::VkImageLayout			newLayout,
						vk::VkAccessFlags			srcAccessMask,
						vk::VkAccessFlags			dstAccessMask)
{
	vk::VkImageMemoryBarrier barrier;
	barrier.sType							= vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
	barrier.pNext							= DE_NULL;
	barrier.srcAccessMask					= srcAccessMask;
	barrier.dstAccessMask					= dstAccessMask;
	barrier.oldLayout						= oldLayout;
	barrier.newLayout						= newLayout;
	barrier.srcQueueFamilyIndex				= VK_QUEUE_FAMILY_IGNORED;
	barrier.dstQueueFamilyIndex				= VK_QUEUE_FAMILY_IGNORED;
	barrier.image							= image;
	barrier.subresourceRange.aspectMask		= aspectMask;
	barrier.subresourceRange.baseMipLevel	= 0;
	barrier.subresourceRange.levelCount		= 1;
	barrier.subresourceRange.baseArrayLayer = 0;
	barrier.subresourceRange.layerCount		= 1;

	vk.cmdPipelineBarrier(cmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
						  0, (const vk::VkMemoryBarrier*)DE_NULL,
						  0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
						  1, &barrier);
}